

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

UniValue *
cfd::core::ConvertToString<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  string *in_RSI;
  UniValue *in_RDI;
  UniValue json_value;
  string *result;
  UniValue *this;
  string *in_stack_ffffffffffffff78;
  UniValue *in_stack_ffffffffffffff80;
  undefined1 local_68 [104];
  
  this = in_RDI;
  std::__cxx11::string::string((string *)&stack0xffffffffffffff78,in_RSI);
  UniValue::UniValue(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  UniValue::write_abi_cxx11_((uint)this,(uint)local_68);
  UniValue::~UniValue(this);
  return in_RDI;
}

Assistant:

inline std::string ConvertToString(const T& value) {  // NOLINT
  UniValue json_value(static_cast<T>(value));
  std::string result = json_value.write();
  return result;
}